

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_printer.h
# Opt level: O3

void MyGame_Example_Vec3_print_json_struct(flatcc_json_printer_t *ctx,void *p)

{
  flatcc_json_printer_float_struct_field(ctx,0,p,0,"x",1);
  flatcc_json_printer_float_struct_field(ctx,1,p,4,"y",1);
  flatcc_json_printer_float_struct_field(ctx,2,p,8,"z",1);
  flatcc_json_printer_double_struct_field(ctx,3,p,0x10,"test1",5);
  flatcc_json_printer_int8_enum_struct_field
            (ctx,4,p,0x18,"test2",5,MyGame_Example_Color_print_json_enum);
  flatcc_json_printer_embedded_struct_field
            (ctx,5,p,0x1a,"test3",5,MyGame_Example_Test_print_json_struct);
  return;
}

Assistant:

static void MyGame_Example_Vec3_print_json_struct(flatcc_json_printer_t *ctx, const void *p)
{
    flatcc_json_printer_float_struct_field(ctx, 0, p, 0, "x", 1);
    flatcc_json_printer_float_struct_field(ctx, 1, p, 4, "y", 1);
    flatcc_json_printer_float_struct_field(ctx, 2, p, 8, "z", 1);
    flatcc_json_printer_double_struct_field(ctx, 3, p, 16, "test1", 5);
    flatcc_json_printer_int8_enum_struct_field(ctx, 4, p, 24, "test2", 5, MyGame_Example_Color_print_json_enum);
    flatcc_json_printer_embedded_struct_field(ctx, 5, p, 26, "test3", 5, MyGame_Example_Test_print_json_struct);
}